

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integral_image_simd.cpp
# Opt level: O1

void compute_padded_integral_img_faster_alg(float *gray_image,integral_image *iimage)

{
  float fVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  float fVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  byte bVar22;
  uint uVar23;
  int iVar24;
  uint uVar25;
  long lVar26;
  ulong uVar27;
  int iVar28;
  float *pfVar29;
  int iVar30;
  int iVar31;
  float *pfVar32;
  long lVar33;
  ulong uVar34;
  float *pfVar35;
  float *pfVar36;
  float *pfVar37;
  float *pfVar38;
  float *pfVar39;
  int iVar40;
  ulong uVar41;
  long lVar42;
  long lVar43;
  float *pfVar44;
  int iVar45;
  ushort uVar46;
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [16];
  undefined1 auVar54 [64];
  float fVar55;
  float fVar56;
  undefined1 auVar57 [16];
  float *local_b8;
  int local_90;
  float *local_78;
  float *local_70;
  float *local_68;
  undefined1 auVar53 [32];
  undefined1 auVar58 [32];
  
  pfVar36 = iimage->padded_data;
  iVar2 = iimage->data_width;
  lVar33 = (long)iVar2;
  iVar3 = iimage->data_height;
  iVar30 = iimage->width;
  iVar28 = iimage->height;
  iVar45 = iVar2 - iVar30;
  uVar23 = iVar45 / 2;
  uVar41 = (ulong)uVar23;
  if (1 < iVar45) {
    uVar27 = 0;
    do {
      uVar25 = 0;
      if (7 < iVar2) {
        memset(pfVar36 + uVar27,0,(ulong)(iVar2 - 8U >> 3) * 0x20 + 0x20);
        uVar25 = (iVar2 - 8U & 0xfffffff8) + 8;
      }
      if ((int)uVar25 < iVar2) {
        memset(pfVar36 + (int)((int)uVar27 + uVar25),0,(ulong)(~uVar25 + iVar2) * 4 + 4);
      }
      uVar27 = (ulong)(uint)((int)uVar27 + iVar2);
      uVar41 = uVar41 - 1;
    } while (uVar41 != 0);
  }
  if ((int)uVar23 < iVar3) {
    iVar24 = uVar23 - 7;
    iVar31 = 8;
    if (8 < iVar24) {
      iVar31 = iVar24;
    }
    iVar40 = 0;
    do {
      lVar26 = 0;
      if (0xf < iVar45) {
        memset(pfVar36 + (int)(iVar2 * (uVar23 + iVar40)),0,(ulong)(iVar31 - 1U >> 3) * 0x20 + 0x20)
        ;
        lVar26 = 0;
        do {
          lVar26 = lVar26 + 8;
        } while (lVar26 < iVar24);
      }
      uVar25 = (uint)lVar26;
      if ((int)uVar25 < (int)uVar23) {
        memset(pfVar36 + (int)((uVar23 + iVar40) * iVar2 + uVar25),0,
               (ulong)(~uVar25 + uVar23) * 4 + 4);
      }
      iVar40 = iVar40 + 1;
    } while (iVar40 != iVar3 - uVar23);
  }
  lVar43 = (long)iimage->data_width;
  uVar25 = iimage->width;
  lVar26 = (long)(int)uVar25;
  uVar4 = iimage->height;
  uVar41 = (ulong)uVar25;
  pfVar35 = iimage->data;
  if (lVar26 < 3) {
    uVar27 = 0;
    fVar55 = 0.0;
    fVar56 = 0.0;
  }
  else {
    fVar56 = 0.0;
    uVar27 = 0;
    fVar55 = 0.0;
    do {
      fVar19 = fVar56 + gray_image[uVar27];
      pfVar35[uVar27] = fVar19;
      fVar56 = fVar19 + gray_image[uVar27 + 1];
      pfVar35[uVar27 + 1] = fVar56;
      fVar1 = gray_image[uVar41 + uVar27];
      pfVar35[lVar43 + uVar27] = fVar19 + fVar55 + fVar1;
      fVar55 = fVar55 + fVar1 + gray_image[uVar41 + uVar27 + 1];
      pfVar35[lVar43 + uVar27 + 1] = fVar55 + pfVar35[uVar27 + 1];
      uVar27 = uVar27 + 2;
    } while ((long)uVar27 < lVar26 + -2);
  }
  if ((int)uVar27 < (int)uVar25) {
    uVar27 = uVar27 & 0xffffffff;
    do {
      fVar56 = fVar56 + gray_image[uVar27];
      pfVar35[uVar27] = fVar56;
      fVar55 = fVar55 + gray_image[lVar26 + uVar27];
      pfVar35[lVar43 + uVar27] = fVar56 + fVar55;
      uVar27 = uVar27 + 1;
    } while (uVar41 != uVar27);
  }
  uVar27 = 2;
  local_90 = (int)(lVar26 + -2);
  if (4 < (int)uVar4) {
    lVar26 = (long)(int)uVar25;
    pfVar32 = pfVar35 + lVar43 * 3 + 1;
    pfVar38 = gray_image + lVar26 * 3 + 1;
    pfVar37 = pfVar35 + lVar43 + 1;
    pfVar39 = pfVar35 + lVar43 * 2 + 1;
    pfVar44 = gray_image + lVar26 * 2 + 1;
    local_b8 = pfVar35 + lVar43 * 3;
    local_68 = gray_image + lVar26 * 3;
    local_70 = pfVar35 + lVar43 * 2;
    local_78 = pfVar35 + lVar43;
    pfVar29 = gray_image + lVar26 * 2;
    uVar27 = 2;
    do {
      fVar56 = 0.0;
      uVar34 = 0;
      auVar54 = ZEXT1664(ZEXT816(0) << 0x40);
      if (2 < (int)uVar25) {
        uVar34 = 0;
        do {
          fVar55 = auVar54._0_4_ + pfVar44[uVar34 - 1];
          fVar1 = fVar55 + pfVar37[uVar34 - 1];
          pfVar39[uVar34 - 1] = fVar1;
          fVar55 = fVar55 + pfVar44[uVar34];
          auVar54 = ZEXT464((uint)fVar55);
          pfVar39[uVar34] = fVar55 + pfVar37[uVar34];
          fVar55 = pfVar38[uVar34 - 1];
          pfVar32[uVar34 - 1] = fVar1 + fVar56 + fVar55;
          fVar56 = fVar56 + fVar55 + pfVar38[uVar34];
          pfVar32[uVar34] = fVar56 + pfVar39[uVar34];
          uVar34 = uVar34 + 2;
        } while ((long)uVar34 < (long)local_90);
      }
      if ((int)uVar34 < (int)uVar25) {
        uVar34 = uVar34 & 0xffffffff;
        lVar42 = 0;
        do {
          fVar55 = auVar54._0_4_ + pfVar29[uVar34 + lVar42];
          auVar54 = ZEXT464((uint)fVar55);
          fVar55 = fVar55 + local_78[uVar34 + lVar42];
          local_70[uVar34 + lVar42] = fVar55;
          fVar56 = fVar56 + local_68[uVar34 + lVar42];
          local_b8[uVar34 + lVar42] = fVar55 + fVar56;
          lVar42 = lVar42 + 1;
        } while (uVar41 - uVar34 != lVar42);
      }
      uVar27 = uVar27 + 2;
      pfVar32 = pfVar32 + lVar43 * 2;
      pfVar38 = pfVar38 + lVar26 * 2;
      pfVar37 = pfVar37 + lVar43 * 2;
      pfVar39 = pfVar39 + lVar43 * 2;
      pfVar44 = pfVar44 + lVar26 * 2;
      local_b8 = local_b8 + lVar43 * 2;
      local_68 = local_68 + lVar26 * 2;
      local_70 = local_70 + lVar43 * 2;
      local_78 = local_78 + lVar43 * 2;
      pfVar29 = pfVar29 + lVar26 * 2;
    } while ((long)uVar27 < (long)(int)uVar4 + -2);
  }
  if ((int)uVar27 < (int)uVar4) {
    uVar27 = uVar27 & 0xffffffff;
    lVar26 = (long)(int)uVar25;
    pfVar38 = pfVar35 + lVar43 * uVar27 + 1;
    lVar42 = (uVar27 - 1) * lVar43;
    pfVar37 = pfVar35 + lVar42 + 1;
    pfVar39 = gray_image + lVar26 * uVar27 + 1;
    pfVar29 = pfVar35 + lVar43 * uVar27;
    pfVar35 = pfVar35 + lVar42;
    pfVar32 = gray_image + lVar26 * uVar27;
    do {
      auVar54 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar41 = 0;
      if (2 < (int)uVar25) {
        uVar41 = 0;
        do {
          fVar56 = auVar54._0_4_ + pfVar39[uVar41 - 1];
          pfVar38[uVar41 - 1] = fVar56 + pfVar37[uVar41 - 1];
          fVar56 = fVar56 + pfVar39[uVar41];
          auVar54 = ZEXT464((uint)fVar56);
          pfVar38[uVar41] = fVar56 + pfVar37[uVar41];
          uVar41 = uVar41 + 2;
        } while ((long)uVar41 < (long)local_90);
      }
      if ((int)uVar41 < (int)uVar25) {
        uVar41 = uVar41 & 0xffffffff;
        do {
          fVar56 = auVar54._0_4_ + pfVar32[uVar41];
          auVar54 = ZEXT464((uint)fVar56);
          pfVar29[uVar41] = fVar56 + pfVar35[uVar41];
          uVar41 = uVar41 + 1;
        } while (uVar25 != uVar41);
      }
      uVar27 = uVar27 + 1;
      pfVar38 = pfVar38 + lVar43;
      pfVar37 = pfVar37 + lVar43;
      pfVar39 = pfVar39 + lVar26;
      pfVar29 = pfVar29 + lVar43;
      pfVar35 = pfVar35 + lVar43;
      pfVar32 = pfVar32 + lVar26;
    } while (uVar27 != uVar4);
  }
  iVar45 = uVar23 + iVar28;
  if (0 < iVar28) {
    iVar28 = iVar30 + uVar23;
    lVar26 = (long)(int)uVar23;
    pfVar35 = pfVar36 + lVar33 * lVar26;
    auVar54 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar47 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      fVar56 = pfVar36[(long)((int)lVar26 * iVar2 + iVar28) + -1];
      auVar57._4_4_ = fVar56;
      auVar57._0_4_ = fVar56;
      auVar57._8_4_ = fVar56;
      auVar57._12_4_ = fVar56;
      auVar58._16_4_ = fVar56;
      auVar58._0_16_ = auVar57;
      auVar58._20_4_ = fVar56;
      auVar58._24_4_ = fVar56;
      auVar58._28_4_ = fVar56;
      lVar43 = (long)iVar28;
      iVar31 = iVar28;
      if (iVar28 < (int)(lVar33 + -7)) {
        do {
          *(undefined1 (*) [32])(pfVar35 + lVar43) = auVar58;
          lVar43 = lVar43 + 8;
        } while (lVar43 < lVar33 + -7);
        iVar31 = (int)lVar43;
      }
      if (iVar31 < iVar2) {
        auVar48 = vpbroadcastq_avx512f();
        auVar49 = vbroadcastss_avx512f(auVar57);
        uVar41 = 0;
        do {
          auVar50 = vpbroadcastq_avx512f();
          auVar51 = vporq_avx512f(auVar50,auVar54);
          auVar50 = vporq_avx512f(auVar50,auVar47);
          uVar20 = vpcmpuq_avx512f(auVar50,auVar48,2);
          uVar21 = vpcmpuq_avx512f(auVar51,auVar48,2);
          bVar22 = (byte)uVar21;
          uVar46 = CONCAT11(bVar22,(byte)uVar20);
          pfVar29 = pfVar35 + (long)iVar31 + uVar41;
          bVar5 = (bool)((byte)uVar20 & 1);
          bVar6 = (bool)((byte)(uVar46 >> 1) & 1);
          bVar7 = (bool)((byte)(uVar46 >> 2) & 1);
          bVar8 = (bool)((byte)(uVar46 >> 3) & 1);
          bVar9 = (bool)((byte)(uVar46 >> 4) & 1);
          bVar10 = (bool)((byte)(uVar46 >> 5) & 1);
          bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
          bVar12 = (bool)((byte)(uVar46 >> 7) & 1);
          bVar13 = (bool)(bVar22 >> 1 & 1);
          bVar14 = (bool)(bVar22 >> 2 & 1);
          bVar15 = (bool)(bVar22 >> 3 & 1);
          bVar16 = (bool)(bVar22 >> 4 & 1);
          bVar17 = (bool)(bVar22 >> 5 & 1);
          bVar18 = (bool)(bVar22 >> 6 & 1);
          *pfVar29 = (float)((uint)bVar5 * auVar49._0_4_ | (uint)!bVar5 * (int)*pfVar29);
          pfVar29[1] = (float)((uint)bVar6 * auVar49._4_4_ | (uint)!bVar6 * (int)pfVar29[1]);
          pfVar29[2] = (float)((uint)bVar7 * auVar49._8_4_ | (uint)!bVar7 * (int)pfVar29[2]);
          pfVar29[3] = (float)((uint)bVar8 * auVar49._12_4_ | (uint)!bVar8 * (int)pfVar29[3]);
          pfVar29[4] = (float)((uint)bVar9 * auVar49._16_4_ | (uint)!bVar9 * (int)pfVar29[4]);
          pfVar29[5] = (float)((uint)bVar10 * auVar49._20_4_ | (uint)!bVar10 * (int)pfVar29[5]);
          pfVar29[6] = (float)((uint)bVar11 * auVar49._24_4_ | (uint)!bVar11 * (int)pfVar29[6]);
          pfVar29[7] = (float)((uint)bVar12 * auVar49._28_4_ | (uint)!bVar12 * (int)pfVar29[7]);
          pfVar29[8] = (float)((uint)(bVar22 & 1) * auVar49._32_4_ |
                              (uint)!(bool)(bVar22 & 1) * (int)pfVar29[8]);
          pfVar29[9] = (float)((uint)bVar13 * auVar49._36_4_ | (uint)!bVar13 * (int)pfVar29[9]);
          pfVar29[10] = (float)((uint)bVar14 * auVar49._40_4_ | (uint)!bVar14 * (int)pfVar29[10]);
          pfVar29[0xb] = (float)((uint)bVar15 * auVar49._44_4_ | (uint)!bVar15 * (int)pfVar29[0xb]);
          pfVar29[0xc] = (float)((uint)bVar16 * auVar49._48_4_ | (uint)!bVar16 * (int)pfVar29[0xc]);
          pfVar29[0xd] = (float)((uint)bVar17 * auVar49._52_4_ | (uint)!bVar17 * (int)pfVar29[0xd]);
          pfVar29[0xe] = (float)((uint)bVar18 * auVar49._56_4_ | (uint)!bVar18 * (int)pfVar29[0xe]);
          pfVar29[0xf] = (float)((uint)(bVar22 >> 7) * auVar49._60_4_ |
                                (uint)!(bool)(bVar22 >> 7) * (int)pfVar29[0xf]);
          uVar41 = uVar41 + 0x10;
        } while (((lVar33 - iVar31) + 0xfU & 0xfffffffffffffff0) != uVar41);
      }
      lVar26 = lVar26 + 1;
      pfVar35 = pfVar35 + lVar33;
    } while (lVar26 < iVar45);
  }
  if (iVar45 < iVar3) {
    iVar28 = (uVar23 - 7) + iVar30;
    lVar26 = (long)iVar45;
    pfVar35 = pfVar36 + (lVar26 + -1) * lVar33;
    pfVar29 = pfVar36 + lVar33 * lVar26;
    do {
      lVar43 = (long)(int)uVar23;
      uVar25 = uVar23;
      if ((int)uVar23 < iVar28) {
        do {
          *(undefined1 (*) [32])(pfVar29 + lVar43) = *(undefined1 (*) [32])(pfVar35 + lVar43);
          lVar43 = lVar43 + 8;
        } while (lVar43 < iVar28);
        uVar25 = (uint)lVar43;
      }
      if ((int)uVar25 < (int)(uVar23 + iVar30)) {
        lVar43 = (long)(int)uVar25;
        do {
          pfVar29[lVar43] = pfVar35[lVar43];
          lVar43 = lVar43 + 1;
        } while ((int)(uVar23 + iVar30) != lVar43);
      }
      lVar26 = lVar26 + 1;
      pfVar35 = pfVar35 + lVar33;
      pfVar29 = pfVar29 + lVar33;
    } while (lVar26 < iVar3);
  }
  if (iVar45 < iVar3) {
    lVar26 = (long)iVar45;
    iVar30 = uVar23 + iVar30;
    fVar56 = pfVar36[(long)((iVar45 + -1) * iVar2 + iVar30) + -1];
    auVar52._4_4_ = fVar56;
    auVar52._0_4_ = fVar56;
    auVar52._8_4_ = fVar56;
    auVar52._12_4_ = fVar56;
    auVar53._16_4_ = fVar56;
    auVar53._0_16_ = auVar52;
    auVar53._20_4_ = fVar56;
    auVar53._24_4_ = fVar56;
    auVar53._28_4_ = fVar56;
    auVar54 = vbroadcastss_avx512f(auVar52);
    pfVar36 = pfVar36 + lVar33 * lVar26;
    auVar47 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar48 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      lVar43 = (long)iVar30;
      iVar28 = iVar30;
      if (iVar30 < (int)(lVar33 + -7)) {
        do {
          *(undefined1 (*) [32])(pfVar36 + lVar43) = auVar53;
          lVar43 = lVar43 + 8;
        } while (lVar43 < lVar33 + -7);
        iVar28 = (int)lVar43;
      }
      if (iVar28 < iVar2) {
        auVar49 = vpbroadcastq_avx512f();
        uVar41 = 0;
        do {
          auVar50 = vpbroadcastq_avx512f();
          auVar51 = vporq_avx512f(auVar50,auVar47);
          auVar50 = vporq_avx512f(auVar50,auVar48);
          uVar20 = vpcmpuq_avx512f(auVar50,auVar49,2);
          uVar21 = vpcmpuq_avx512f(auVar51,auVar49,2);
          bVar22 = (byte)uVar21;
          uVar46 = CONCAT11(bVar22,(byte)uVar20);
          pfVar35 = pfVar36 + (long)iVar28 + uVar41;
          bVar5 = (bool)((byte)uVar20 & 1);
          bVar6 = (bool)((byte)(uVar46 >> 1) & 1);
          bVar7 = (bool)((byte)(uVar46 >> 2) & 1);
          bVar8 = (bool)((byte)(uVar46 >> 3) & 1);
          bVar9 = (bool)((byte)(uVar46 >> 4) & 1);
          bVar10 = (bool)((byte)(uVar46 >> 5) & 1);
          bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
          bVar12 = (bool)((byte)(uVar46 >> 7) & 1);
          bVar13 = (bool)(bVar22 >> 1 & 1);
          bVar14 = (bool)(bVar22 >> 2 & 1);
          bVar15 = (bool)(bVar22 >> 3 & 1);
          bVar16 = (bool)(bVar22 >> 4 & 1);
          bVar17 = (bool)(bVar22 >> 5 & 1);
          bVar18 = (bool)(bVar22 >> 6 & 1);
          *pfVar35 = (float)((uint)bVar5 * auVar54._0_4_ | (uint)!bVar5 * (int)*pfVar35);
          pfVar35[1] = (float)((uint)bVar6 * auVar54._4_4_ | (uint)!bVar6 * (int)pfVar35[1]);
          pfVar35[2] = (float)((uint)bVar7 * auVar54._8_4_ | (uint)!bVar7 * (int)pfVar35[2]);
          pfVar35[3] = (float)((uint)bVar8 * auVar54._12_4_ | (uint)!bVar8 * (int)pfVar35[3]);
          pfVar35[4] = (float)((uint)bVar9 * auVar54._16_4_ | (uint)!bVar9 * (int)pfVar35[4]);
          pfVar35[5] = (float)((uint)bVar10 * auVar54._20_4_ | (uint)!bVar10 * (int)pfVar35[5]);
          pfVar35[6] = (float)((uint)bVar11 * auVar54._24_4_ | (uint)!bVar11 * (int)pfVar35[6]);
          pfVar35[7] = (float)((uint)bVar12 * auVar54._28_4_ | (uint)!bVar12 * (int)pfVar35[7]);
          pfVar35[8] = (float)((uint)(bVar22 & 1) * auVar54._32_4_ |
                              (uint)!(bool)(bVar22 & 1) * (int)pfVar35[8]);
          pfVar35[9] = (float)((uint)bVar13 * auVar54._36_4_ | (uint)!bVar13 * (int)pfVar35[9]);
          pfVar35[10] = (float)((uint)bVar14 * auVar54._40_4_ | (uint)!bVar14 * (int)pfVar35[10]);
          pfVar35[0xb] = (float)((uint)bVar15 * auVar54._44_4_ | (uint)!bVar15 * (int)pfVar35[0xb]);
          pfVar35[0xc] = (float)((uint)bVar16 * auVar54._48_4_ | (uint)!bVar16 * (int)pfVar35[0xc]);
          pfVar35[0xd] = (float)((uint)bVar17 * auVar54._52_4_ | (uint)!bVar17 * (int)pfVar35[0xd]);
          pfVar35[0xe] = (float)((uint)bVar18 * auVar54._56_4_ | (uint)!bVar18 * (int)pfVar35[0xe]);
          pfVar35[0xf] = (float)((uint)(bVar22 >> 7) * auVar54._60_4_ |
                                (uint)!(bool)(bVar22 >> 7) * (int)pfVar35[0xf]);
          uVar41 = uVar41 + 0x10;
        } while (((lVar33 - iVar28) + 0xfU & 0xfffffffffffffff0) != uVar41);
      }
      lVar26 = lVar26 + 1;
      pfVar36 = pfVar36 + lVar33;
    } while (lVar26 < iVar3);
  }
  return;
}

Assistant:

void compute_padded_integral_img_faster_alg(float *gray_image, struct integral_image * iimage) {
    
    float *iimage_padded_data = iimage->padded_data;

    int data_width = iimage->data_width;
    int data_height = iimage->data_height;
    int width = iimage->width;
    int height = iimage->height;

    int border = (data_width - width) / 2; 
    //int border = PADDING_SIZE;

    // Block layout of padded integral image:
    // AAA
    // BIC
    // BDE

    __m256 zeros_float = _mm256_setzero_ps();

    // BLOCK A
    for (int j = 0; j < border; ++j) {
        int i = 0;
        for (; i < data_width - 7; i+=8) {
            _mm256_storeu_ps(iimage_padded_data + j * data_width + i, zeros_float);
        }
        for (; i < data_width; ++i) {
            iimage_padded_data[j * data_width + i] = 0.0f;
        }
    }

    // BLOCK B
    for (int j = border; j < data_height; ++j) {
        int i = 0;
        for (; i < border - 7; i+=8) {
            _mm256_storeu_ps(iimage_padded_data + j * data_width + i, zeros_float);
        }
        for (; i < border; ++i) {
            iimage_padded_data[j * data_width + i] = 0.0f;
        }
    }

    // BLOCK I
    {
        float sum = 0.0f;
        float sum1 = 0.0f;
        
        int data_width = iimage->data_width;
        int width = iimage->width;
        int width_limit = width - 2;
        int height_limit = iimage->height - 2;
        float *iimage_data = iimage->data;

        int i = 0;
        // first row extra, since we don't have 0 padding
        for (i = 0; i < width_limit; i += 2) {
            sum += gray_image[i];
            iimage_data[i] = sum;
            sum += gray_image[i + 1];
            iimage_data[i + 1] = sum;

            sum1 += gray_image[width + i];
            iimage_data[data_width + i] = iimage_data[i] + sum1;
            sum1 += gray_image[width + i + 1];
            iimage_data[data_width + i + 1] = iimage_data[i + 1] + sum1;
        }

        // Handle last element of an image with odd width extra.
        // If previous stride = 2, then there should only be one element covered in this loop.
        // This might change if we increase the stride.
        for (; i < width; ++i) {
            sum += gray_image[i];
            iimage_data[i] = sum;
            // printf("row 0, col %i sum: %f\n", i, sum);
            sum1 += gray_image[width + i];
            // printf("row 1, col %i sum: %f\n", i, sum1);
            iimage_data[data_width + i] = iimage_data[i] + sum1;
        }

        // Handle all elements after the first row.
        i = 2;
        for (; i < height_limit; i += 2) {
            sum = 0.0f;
            sum1 = 0.0f;
            int j = 0;
            for (; j < width_limit; j += 2) {
                sum += gray_image[i * width + j];
                iimage_data[i * data_width + j] = iimage_data[(i - 1) * data_width + j] + sum;
                sum += gray_image[i * width + j + 1];
                iimage_data[i * data_width + j + 1] = iimage_data[(i - 1) * data_width + j + 1] + sum;

                sum1 += gray_image[(i + 1) * width + j];
                iimage_data[(i + 1) * data_width + j] = iimage_data[i * data_width + j] + sum1;
                sum1 += gray_image[(i + 1) * width + j + 1];
                iimage_data[(i + 1) * data_width + j + 1] = iimage_data[i * data_width + j + 1] + sum1;
            }
            // printf("j: %i\n", j);

            // Handle last element of an image with odd width extra.
            // If previous stride = 2, then there should only be one element covered in this loop.
            // This might change if we increase the stride.
            for (; j < width; ++j) {
                // printf("j: %i; sum1: %f\n", j, sum1);
                sum += gray_image[i * width + j];
                iimage_data[i * data_width + j] = iimage_data[(i - 1) * data_width + j] + sum;

                sum1 += gray_image[(i + 1) * width + j];
                // printf("sum1: %f\n", sum1);
                iimage_data[(i + 1) * data_width + j] = iimage_data[i * data_width + j] + sum1;
            }
        }

        // Handle last element of an image with odd height extra.
        // If previous stride = 2, then there should only be one row covered in this loop.
        // This might change if we increase the stride.
        for (; i < iimage->height ; ++i) {
            sum = 0.0f;
            int j = 0;
            for (; j < width_limit; j += 2) {
                // printf("j: %i; sum1: %f\n", j, sum);

                sum += gray_image[i * width + j];
                // printf("j: %i; sum1: %f\n", j, sum);
                iimage_data[i * data_width + j] = iimage_data[(i - 1) * data_width + j] + sum;
                sum += gray_image[i * width + j + 1];
                // printf("j: %i; sum1: %f\n", j, sum);

                iimage_data[i * data_width + j + 1] = iimage_data[(i - 1) * data_width + j + 1] + sum;
            }
            // printf("j: %i\n", j);

            for (; j < width; ++j) {
                sum += gray_image[i * width + j];
                // printf("j: %i; sum1: %f\n", j, sum);

                iimage_data[i * data_width + j] = iimage_data[(i - 1) * data_width + j] + sum;
            }
        }
    }

    // BLOCK C
    for (int j = border; j < border + height; ++j) {
        float last_element_in_row_float = iimage_padded_data[j * data_width + border + width - 1];
        __m256 last_element_in_row_vec = _mm256_set1_ps(last_element_in_row_float);
        int i = width + border;
        for (; i < data_width - 7; i+=8) {
            _mm256_storeu_ps(iimage_padded_data + j * data_width + i, last_element_in_row_vec);
        }
        for (; i < data_width; ++i) {
            iimage_padded_data[j * data_width + i] = last_element_in_row_float;
        }
    }

    // BLOCK D   
    for (int j = border + height; j < data_height; ++j) {
        int i = border;
        for (; i < width + border - 7; i+=8) {
            __m256 prev_elements_in_row = _mm256_loadu_ps(iimage_padded_data + (j-1) * data_width + i);
            _mm256_storeu_ps(iimage_padded_data + j * data_width + i, prev_elements_in_row);
        }
        for (; i < width + border; ++i) {
            iimage_padded_data[j * data_width + i] = iimage_padded_data[(j-1) * data_width + i];
        }
    }

    // BLOCK E
    int index_last_element = (border + height - 1) * data_width + border + width - 1;
    float max_value_float = iimage_padded_data[index_last_element];
    __m256 max_value_vec = _mm256_set1_ps(max_value_float);
    for (int j = border + height; j < data_height; ++j) {
        int i = border + width;
        for (; i < data_width - 7; i+=8) {
            _mm256_storeu_ps(iimage_padded_data + j * data_width + i, max_value_vec);
        }
        for (; i < data_width; ++i) {
            iimage_padded_data[j * data_width + i] = max_value_float;
        }
    }
    
}